

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int nWords;
  int v;
  uint uCanonPhase;
  int nVars_local;
  word *pTruth_local;
  
  nWords = 0;
  iVar1 = Abc_TtWordNum(nVars);
  Abc_TtCopy(Abc_TtCanonicizePhase::pCopy1,pTruth,iVar1,0);
  if ((long)pTruth[iVar1 + -1] < 0) {
    Abc_TtNot(pTruth,iVar1);
    nWords = 1 << ((byte)nVars & 0x1f);
  }
  for (local_1c = nVars + -1; 5 < local_1c; local_1c = local_1c + -1) {
    iVar2 = Abc_TtCanonicizePhaseVar6(pTruth,nVars,local_1c);
    if (iVar2 == 1) {
      nWords = 1 << ((byte)local_1c & 0x1f) ^ nWords;
    }
  }
  for (; -1 < local_1c; local_1c = local_1c + -1) {
    iVar2 = Abc_TtCanonicizePhaseVar5(pTruth,nVars,local_1c);
    if (iVar2 == 1) {
      nWords = 1 << ((byte)local_1c & 0x1f) ^ nWords;
    }
  }
  Abc_TtCopy(Abc_TtCanonicizePhase::pCopy2,pTruth,iVar1,0);
  Abc_TtImplementNpnConfig(Abc_TtCanonicizePhase::pCopy2,nVars,(char *)0x0,nWords);
  iVar1 = Abc_TtEqual(Abc_TtCanonicizePhase::pCopy1,Abc_TtCanonicizePhase::pCopy2,iVar1);
  if (iVar1 == 0) {
    printf("Canonical form verification failed!\n");
  }
  return nWords;
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}